

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

char __thiscall
loltoml::v_0_1_1::detail::parser_t<comments_skipper_t>::parse_chars<3ul>
          (parser_t<comments_skipper_t> *this,char (*expected) [3])

{
  size_t sVar1;
  char cVar2;
  long lVar3;
  parser_error_t *this_00;
  bool bVar4;
  char ch;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  size_t offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if ((*expected)[2] != '\0') {
    __assert_fail("expected[N - 1] == \'\\0\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/include/loltoml/detail/parser.hpp"
                  ,0x6e,
                  "char loltoml::detail::parser_t<comments_skipper_t>::parse_chars(const char (&)[N]) [Handler = comments_skipper_t, N = 3UL]"
                 );
  }
  cVar2 = input_stream_t::get(&this->input);
  if ((cVar2 != (*expected)[0]) && (cVar2 != (*expected)[1])) {
    escape_char_abi_cxx11_(&local_b0,(detail *)(ulong)(uint)(int)(*expected)[0],ch);
    std::operator+(&local_d0,"\'",&local_b0);
    std::operator+(&list,&local_d0,"\'");
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    bVar4 = true;
    lVar3 = 1;
    uVar5 = extraout_RDX;
    while (bVar4) {
      escape_char_abi_cxx11_(&local_50,(detail *)(ulong)(uint)(int)(*expected)[lVar3],(char)uVar5);
      std::operator+(&local_b0,", \'",&local_50);
      std::operator+(&local_d0,&local_b0,"\'");
      std::__cxx11::string::append((string *)&list);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      bVar4 = false;
      lVar3 = 2;
      uVar5 = extraout_RDX_00;
    }
    this_00 = (parser_error_t *)__cxa_allocate_exception(0x30);
    std::operator+(&local_70,"Expected one of the following symbols: ",&list);
    sVar1 = (this->input).m_processed;
    offset = 0;
    if (sVar1 != 0) {
      offset = sVar1 - 1;
    }
    parser_error_t::parser_error_t(this_00,&local_70,offset);
    __cxa_throw(this_00,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
  }
  return cVar2;
}

Assistant:

char parse_chars(const char (&expected)[N]) {
        static_assert(N > 0, "No expected characters specified");
        assert(expected[N - 1] == '\0');

        char result = input.get();
        for (std::size_t i = 0; i + 1 < N; ++i) {
            if (result == expected[i]) {
                return result;
            }
        }

        std::string list = "\'" + escape_char(expected[0]) + "\'";

        for (std::size_t i = 1; i + 1 < N; ++i) {
            list += ", \'" + escape_char(expected[i]) + "\'";
        }

        throw parser_error_t("Expected one of the following symbols: " + list, last_char_offset());
    }